

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,int a)

{
  word wVar1;
  word *pwVar2;
  word in_ESI;
  scfx_mant *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  scfx_rep *in_stack_ffffffffffffffc0;
  
  scfx_mant::scfx_mant
            (&in_stack_ffffffffffffffc0->m_mant,
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined4 *)&in_RDI[1].m_array = 0;
  *(undefined4 *)((long)&in_RDI[1].m_array + 4) = 0;
  in_RDI[1].m_size = 0;
  *(undefined4 *)&in_RDI[1].field_0xc = 0;
  *(undefined4 *)&in_RDI[2].m_array = 0;
  *(undefined1 *)((long)&in_RDI[2].m_array + 4) = 0;
  if (in_ESI == 0) {
    set_zero(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  else {
    scfx_mant::clear(&in_stack_ffffffffffffffc0->m_mant);
    *(undefined4 *)&in_RDI[2].m_array = 2;
    *(undefined4 *)&in_RDI[1].field_0xc = 2;
    *(undefined4 *)&in_RDI[1].m_array = 2;
    in_RDI[1].m_size = 0;
    if ((int)in_ESI < 1) {
      wVar1 = -in_ESI;
      pwVar2 = scfx_mant::operator[](in_RDI,2);
      *pwVar2 = wVar1;
      *(undefined4 *)((long)&in_RDI[1].m_array + 4) = 0xffffffff;
    }
    else {
      pwVar2 = scfx_mant::operator[](in_RDI,2);
      *pwVar2 = in_ESI;
      *(undefined4 *)((long)&in_RDI[1].m_array + 4) = 1;
    }
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( int a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a != 0 )
    {
        m_mant.clear();
	m_wp = m_msw = m_lsw = 2;
	m_state = normal;
	if( a > 0 )
	{
	    m_mant[2] = a;
	    m_sign = 1;
	}
	else
	{
	    m_mant[2] = -a;
	    m_sign = -1;
	}
    }
    else
        set_zero();
}